

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O3

uint32_t __thiscall
GmmLib::GmmResourceInfoCommon::GetPaddedPitch(GmmResourceInfoCommon *this,uint32_t MipLevel)

{
  int iVar1;
  uint32_t uVar2;
  undefined4 in_register_00000034;
  
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[9])(this,CONCAT44(in_register_00000034,MipLevel));
  uVar2 = 8;
  if ((~(ulong)(this->AuxSurf).Flags.Gpu & 0x20000000002) != 0) {
    uVar2 = (this->Surf).BitsPerPixel;
  }
  return uVar2 * iVar1 >> 3;
}

Assistant:

uint32_t GMM_STDCALL GmmLib::GmmResourceInfoCommon::GetPaddedPitch(uint32_t MipLevel)
{
    uint32_t AlignedWidth;
    uint32_t AlignedPitch;
    uint32_t BitsPerPixel;

    __GMM_ASSERT(MipLevel <= Surf.MaxLod);

    // See note in GetPaddedWidth.
    AlignedWidth = GetPaddedWidth(MipLevel);

    BitsPerPixel = Surf.BitsPerPixel;
    if(AuxSurf.Flags.Gpu.CCS && AuxSurf.Flags.Gpu.__NonMsaaTileYCcs)
    {
        BitsPerPixel = 8; //Aux surface are 8bpp
    }

    AlignedPitch = AlignedWidth * BitsPerPixel >> 3;

    return AlignedPitch;
}